

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O2

int __thiscall
QToolBox::insertItem(QToolBox *this,int index,QWidget *widget,QIcon *icon,QString *text)

{
  QToolBoxPrivate *this_00;
  pointer puVar1;
  int iVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *this_01;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_02;
  QScrollArea *this_03;
  ulong uVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QObject local_50 [8];
  __single_object newPage;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    iVar2 = -1;
    goto LAB_00475e04;
  }
  this_00 = *(QToolBoxPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  QObject::connect(local_40,(char *)widget,(QObject *)"2destroyed(QObject*)",(char *)this,0x66767d);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  newPage._M_t.
  super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>._M_t.
  super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>.
  super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl =
       (__uniq_ptr_data<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>,_true,_true>
        )&DAT_aaaaaaaaaaaaaaaa;
  std::make_unique<QToolBoxPrivate::Page>();
  this_01 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)
            std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::
            operator*(&newPage);
  this_01[2].m_data = widget;
  this_02.m_data = operator_new(0x30);
  QToolBoxButton::QToolBoxButton((QToolBoxButton *)this_02.m_data,(QWidget *)this);
  this_01->m_data = (void *)this_02;
  QVar4.m_size = (size_t)"qt_toolbox_toolboxbutton";
  QVar4.field_0.m_data = this_02.m_data;
  QObject::setObjectName(QVar4);
  QObject::connect(local_50,this_01->m_data_utf8,(QObject *)"2clicked()",(char *)this,0x6676b4);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  this_03 = (QScrollArea *)operator_new(0x28);
  QScrollArea::QScrollArea(this_03,(QWidget *)this);
  this_01[1].m_data = this_03;
  QScrollArea::setWidget(this_03,widget);
  QScrollArea::setWidgetResizable((QScrollArea *)this_01[1].m_data,true);
  QWidget::hide((QWidget *)this_01[1].m_data);
  QFrame::setFrameStyle((QFrame *)this_01[1].m_data,0);
  QToolBoxPrivate::Page::setText((Page *)this_01,text);
  QToolBoxPrivate::Page::setIcon((Page *)this_01,icon);
  if (index < 0) {
    uVar3 = (ulong)((long)(this_00->pageList).
                          super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this_00->pageList).
                         super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
LAB_00475d88:
    std::
    vector<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>,std::allocator<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>>>
    ::
    emplace_back<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>>
              ((vector<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>,std::allocator<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>>>
                *)&this_00->pageList,&newPage);
    iVar2 = 0;
    QBoxLayout::addWidget
              (&this_00->layout->super_QBoxLayout,(QWidget *)this_01->m_data,0,(Alignment)0x0);
    QBoxLayout::addWidget
              (&this_00->layout->super_QBoxLayout,(QWidget *)this_01[1].m_data,0,(Alignment)0x0);
    index = 0;
    if ((int)uVar3 == 0) {
LAB_00475dcd:
      setCurrentIndex(this,iVar2);
      goto LAB_00475dd8;
    }
  }
  else {
    puVar1 = (this_00->pageList).
             super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (ulong)((long)(this_00->pageList).
                          super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3;
    if ((int)uVar3 <= index) goto LAB_00475d88;
    std::
    vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
    ::_M_insert_rval(&this_00->pageList,puVar1 + (uint)index,&newPage);
    QToolBoxPrivate::relayout(this_00);
    if (this_00->currentPage != (Page *)0x0) {
      iVar2 = indexOf(this,this_00->currentPage->widget);
      if (iVar2 < index) goto LAB_00475dd8;
      this_00->currentPage = (Page *)0x0;
      goto LAB_00475dcd;
    }
LAB_00475dd8:
    uVar3 = (ulong)(uint)index;
  }
  iVar2 = (int)uVar3;
  QWidget::show((QWidget *)this_01->m_data);
  QToolBoxPrivate::updateTabs(this_00);
  (**(code **)(*(long *)&(this->super_QFrame).super_QWidget + 0x1a8))(this,uVar3 & 0xffffffff);
  std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::~unique_ptr
            (&newPage);
LAB_00475e04:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QToolBox::insertItem(int index, QWidget *widget, const QIcon &icon, const QString &text)
{
    if (!widget)
        return -1;

    Q_D(QToolBox);
    connect(widget, SIGNAL(destroyed(QObject*)), this, SLOT(_q_widgetDestroyed(QObject*)));

    auto newPage = std::make_unique<QToolBoxPrivate::Page>();
    auto &c = *newPage;
    c.widget = widget;
    c.button = new QToolBoxButton(this);
    c.button->setObjectName("qt_toolbox_toolboxbutton"_L1);
    connect(c.button, SIGNAL(clicked()), this, SLOT(_q_buttonClicked()));

    c.sv = new QScrollArea(this);
    c.sv->setWidget(widget);
    c.sv->setWidgetResizable(true);
    c.sv->hide();
    c.sv->setFrameStyle(QFrame::NoFrame);

    c.setText(text);
    c.setIcon(icon);

    if (index < 0 || index >= static_cast<int>(d->pageList.size())) {
        index = static_cast<int>(d->pageList.size());
        d->pageList.push_back(std::move(newPage));
        d->layout->addWidget(c.button);
        d->layout->addWidget(c.sv);
        if (index == 0)
            setCurrentIndex(index);
    } else {
        d->pageList.insert(d->pageList.cbegin() + index, std::move(newPage));
        d->relayout();
        if (d->currentPage) {
            QWidget *current = d->currentPage->widget;
            int oldindex = indexOf(current);
            if (index <= oldindex) {
                d->currentPage = nullptr; // trigger change
                setCurrentIndex(oldindex);
            }
        }
    }

    c.button->show();

    d->updateTabs();
    itemInserted(index);
    return index;
}